

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command *commands,
               size_t *num_commands,size_t *num_literals)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  BackwardMatch *pBVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  ZopfliNode *local_1508;
  size_t local_14f8;
  size_t local_14e0;
  ulong local_14d0;
  uint local_14a8;
  ulong local_1498;
  size_t local_1490;
  size_t local_1480;
  ulong local_1478;
  void *local_1468;
  BackwardMatch *local_1460;
  ulong local_1458;
  ulong local_1450;
  void *local_1448;
  ulong local_1440;
  uint32_t *local_1438;
  size_t skip;
  size_t match_len;
  BackwardMatch *new_array;
  size_t _new_size;
  size_t j;
  size_t cur_match_end;
  size_t num_found_matches;
  size_t max_length;
  size_t dictionary_start;
  size_t max_distance;
  size_t pos;
  size_t shadow_matches;
  size_t gap;
  BackwardMatch *matches;
  ZopfliNode *nodes;
  ZopfliCostModel model;
  size_t orig_num_commands;
  int orig_dist_cache [4];
  size_t orig_last_insert_len;
  size_t orig_num_literals;
  size_t i;
  size_t cur_match_pos;
  size_t store_end;
  size_t matches_size;
  uint32_t *num_matches;
  size_t max_backward_limit;
  size_t stream_offset;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  size_t distance;
  ulong uStack_7c0;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  ulong local_6e8;
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  BrotliEncoderParams *local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong local_6a0;
  ulong local_698;
  size_t local_690;
  uint8_t *local_688;
  BrotliEncoderDictionary *local_680;
  anon_union_1048_13_a959428b_for_privat *local_678;
  ulong local_670;
  undefined8 local_668;
  long local_660;
  ulong local_658;
  undefined8 local_650;
  ulong local_648;
  size_t j_1;
  size_t i_2;
  ulong local_630;
  ulong local_628;
  uint8_t *local_620;
  anon_union_1048_13_a959428b_for_privat *local_618;
  ulong local_610;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_5e8;
  uint8_t *local_5e0;
  size_t local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  BackwardMatch *local_5c0;
  ulong local_5b8;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t *forest;
  uint32_t *buckets;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  ulong *local_538;
  ulong local_530;
  ulong local_528;
  size_t local_520;
  ulong local_518;
  uint8_t *local_510;
  anon_union_1048_13_a959428b_for_privat *local_508;
  size_t local_500;
  size_t local_4f8;
  undefined8 local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_4b8;
  uint8_t *local_4b0;
  size_t local_4a8;
  ulong local_4a0;
  size_t local_498;
  size_t local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  BackwardMatch *local_470;
  ulong *local_468;
  ulong *local_460;
  ulong *local_458;
  ulong *local_450;
  ulong *local_448;
  ulong *local_440;
  ulong *local_438;
  ulong *local_430;
  size_t local_428;
  anon_union_1048_13_a959428b_for_privat *local_420;
  size_t local_418;
  anon_union_1048_13_a959428b_for_privat *local_410;
  ulong local_408;
  anon_union_1048_13_a959428b_for_privat *local_400;
  size_t local_3f8;
  anon_union_1048_13_a959428b_for_privat *local_3f0;
  size_t local_3e8;
  anon_union_1048_13_a959428b_for_privat *local_3e0;
  ulong local_3d8;
  anon_union_1048_13_a959428b_for_privat *local_3d0;
  ulong local_3c8;
  size_t max_backward;
  ulong local_3b8;
  uint8_t *local_3b0;
  anon_union_1048_13_a959428b_for_privat *local_3a8;
  ulong local_3a0;
  size_t len_2;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t *forest_1;
  uint32_t *buckets_1;
  uint32_t key_1;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_2;
  ulong *local_320;
  ulong local_318;
  long local_310;
  ulong local_308;
  ulong local_300;
  uint8_t *local_2f8;
  anon_union_1048_13_a959428b_for_privat *local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  ulong local_2c8;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2a0;
  uint8_t *local_298;
  size_t local_290;
  ulong local_288;
  ulong local_280;
  size_t local_278;
  ulong *local_270;
  ulong *local_268;
  ulong *local_260;
  ulong *local_258;
  size_t local_250;
  anon_union_1048_13_a959428b_for_privat *local_248;
  size_t local_240;
  anon_union_1048_13_a959428b_for_privat *local_238;
  ulong local_230;
  anon_union_1048_13_a959428b_for_privat *local_228;
  size_t local_220;
  anon_union_1048_13_a959428b_for_privat *local_218;
  size_t local_210;
  anon_union_1048_13_a959428b_for_privat *local_208;
  ulong local_200;
  anon_union_1048_13_a959428b_for_privat *local_1f8;
  ulong local_1f0;
  size_t max_backward_1;
  ulong local_1e0;
  uint8_t *local_1d8;
  anon_union_1048_13_a959428b_for_privat *local_1d0;
  ulong local_1c8;
  size_t len_3;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t *forest_2;
  uint32_t *buckets_2;
  uint32_t key_2;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_3;
  ulong *local_148;
  ulong local_140;
  long local_138;
  ulong local_130;
  size_t local_128;
  uint8_t *local_120;
  anon_union_1048_13_a959428b_for_privat *local_118;
  size_t local_110;
  size_t local_108;
  undefined8 local_100;
  undefined8 local_f8;
  ulong local_f0;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_c8;
  uint8_t *local_c0;
  size_t local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  size_t local_78;
  anon_union_1048_13_a959428b_for_privat *local_70;
  size_t local_68;
  anon_union_1048_13_a959428b_for_privat *local_60;
  ulong local_58;
  anon_union_1048_13_a959428b_for_privat *local_50;
  size_t local_48;
  anon_union_1048_13_a959428b_for_privat *local_40;
  size_t local_38;
  anon_union_1048_13_a959428b_for_privat *local_30;
  ulong local_28;
  anon_union_1048_13_a959428b_for_privat *local_20;
  
  sVar2 = params->stream_offset;
  uVar8 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  if (num_bytes == 0) {
    local_1438 = (uint32_t *)0x0;
  }
  else {
    local_1438 = (uint32_t *)BrotliAllocate(m,num_bytes << 2);
  }
  store_end = num_bytes << 2;
  local_1440 = position;
  if (0x7f < num_bytes) {
    local_1440 = (position + num_bytes) - 0x7f;
  }
  i = 0;
  if (store_end == 0) {
    local_1448 = (void *)0x0;
  }
  else {
    local_1448 = BrotliAllocate(m,num_bytes << 5);
  }
  gap = (size_t)local_1448;
  orig_num_literals = 0;
  do {
    if (num_bytes <= orig_num_literals + 3) {
      sVar2 = *num_literals;
      sVar3 = *last_insert_len;
      uVar4 = *(undefined8 *)dist_cache;
      uVar5 = *(undefined8 *)(dist_cache + 2);
      model.num_bytes_ = *num_commands;
      if (num_bytes == 0xffffffffffffffff) {
        local_1508 = (ZopfliNode *)0x0;
      }
      else {
        local_1508 = (ZopfliNode *)BrotliAllocate(m,(num_bytes + 1) * 0x10);
      }
      InitZopfliCostModel(m,(ZopfliCostModel *)&nodes,&params->dist,num_bytes);
      for (orig_num_literals = 0; orig_num_literals < 2; orig_num_literals = orig_num_literals + 1)
      {
        BrotliInitZopfliNodes(local_1508,num_bytes + 1);
        if (orig_num_literals == 0) {
          ZopfliCostModelSetFromLiteralCosts
                    ((ZopfliCostModel *)&nodes,position,ringbuffer,ringbuffer_mask);
        }
        else {
          ZopfliCostModelSetFromCommands
                    ((ZopfliCostModel *)&nodes,position,ringbuffer,ringbuffer_mask,commands,
                     *num_commands - model.num_bytes_,sVar3);
        }
        *num_commands = model.num_bytes_;
        *num_literals = sVar2;
        *last_insert_len = sVar3;
        *(undefined8 *)dist_cache = uVar4;
        *(undefined8 *)(dist_cache + 2) = uVar5;
        sVar13 = ZopfliIterate(num_bytes,position,ringbuffer,ringbuffer_mask,params,0,dist_cache,
                               (ZopfliCostModel *)&nodes,local_1438,(BackwardMatch *)gap,local_1508)
        ;
        *num_commands = sVar13 + *num_commands;
        BrotliZopfliCreateCommands
                  (num_bytes,position,local_1508,dist_cache,last_insert_len,params,commands,
                   num_literals);
      }
      CleanupZopfliCostModel(m,(ZopfliCostModel *)&nodes);
      BrotliFree(m,local_1508);
      BrotliFree(m,(void *)gap);
      BrotliFree(m,local_1438);
      return;
    }
    uVar9 = position + orig_num_literals;
    local_1450 = uVar8;
    if (uVar9 < uVar8) {
      local_1450 = uVar9;
    }
    uVar14 = uVar9 + sVar2;
    local_1458 = uVar8;
    if (uVar14 < uVar8) {
      local_1458 = uVar14;
    }
    uVar14 = num_bytes - orig_num_literals;
    if (store_end < i + 0x80) {
      if (store_end == 0) {
        local_1460 = (BackwardMatch *)(i + 0x80);
      }
      else {
        local_1460 = (BackwardMatch *)store_end;
      }
      for (new_array = local_1460; new_array < (BackwardMatch *)(i + 0x80);
          new_array = (BackwardMatch *)((long)new_array << 1)) {
      }
      if (new_array == (BackwardMatch *)0x0) {
        local_1468 = (void *)0x0;
      }
      else {
        local_1468 = BrotliAllocate(m,(long)new_array << 3);
      }
      if (store_end != 0) {
        memcpy(local_1468,(void *)gap,store_end << 3);
      }
      BrotliFree(m,(void *)gap);
      gap = (size_t)local_1468;
      store_end = (size_t)new_array;
    }
    local_678 = &hasher->privat;
    local_680 = &params->dictionary;
    local_6b0 = local_1458;
    cur_ix_masked = gap + i * 8;
    local_6a8 = local_1450;
    local_6b8 = params;
    best_len = uVar9 & ringbuffer_mask;
    short_match_max_backward = 1;
    iVar7 = 0x40;
    if (params->quality != 0xb) {
      iVar7 = 0x10;
    }
    local_6e8 = uVar9 - (long)iVar7;
    orig_matches = (BackwardMatch *)cur_ix_masked;
    prev_ix = uVar9;
    if (uVar9 < (ulong)(long)iVar7) {
      local_6e8 = 0;
      orig_matches = (BackwardMatch *)cur_ix_masked;
    }
    while ((prev_ix = prev_ix - 1, local_6e8 < prev_ix && short_match_max_backward < 3 &&
           (uVar10 = uVar9 - prev_ix, uVar10 <= local_1450))) {
      uVar11 = ringbuffer_mask & prev_ix;
      if ((ringbuffer[best_len] == ringbuffer[uVar11]) &&
         (ringbuffer[best_len + 1] == ringbuffer[uVar11 + 1])) {
        local_5e0 = ringbuffer + uVar11;
        local_5e8 = (ulong *)(ringbuffer + best_len);
        limit2 = 0;
        x = (uVar14 >> 3) + 1;
LAB_00137d91:
        x = x - 1;
        if (x != 0) {
          local_430 = local_5e8;
          local_438 = (ulong *)(local_5e0 + limit2);
          if (*local_5e8 == *local_438) goto LAB_00137df3;
          local_440 = local_5e8;
          local_448 = (ulong *)(local_5e0 + limit2);
          iVar7 = 0;
          matching_bits = *local_5e8 ^ *local_448;
          for (uVar11 = matching_bits; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
          {
            iVar7 = iVar7 + 1;
          }
          local_610 = (ulong)iVar7;
          local_5d8 = (local_610 >> 3) + limit2;
          matched = uVar14;
          goto LAB_00137f34;
        }
        matched = (uVar14 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (local_5e0[limit2] != (uint8_t)*local_5e8) {
            local_5d8 = limit2;
            goto LAB_00137f34;
          }
          local_5e8 = (ulong *)((long)local_5e8 + 1);
          limit2 = limit2 + 1;
        }
        local_5d8 = limit2;
LAB_00137f34:
        limit2 = local_5d8;
        if (short_match_max_backward < local_5d8) {
          short_match_max_backward = local_5d8;
          local_5c0 = orig_matches;
          local_5d0 = local_5d8;
          orig_matches->distance = (uint32_t)uVar10;
          orig_matches->length_and_code = (uint32_t)(local_5d8 << 5);
          orig_matches = orig_matches + 1;
          local_5c8 = uVar10;
        }
      }
    }
    local_6a0 = uVar14;
    local_698 = uVar9;
    local_690 = ringbuffer_mask;
    local_688 = ringbuffer;
    if (short_match_max_backward < uVar14) {
      local_530 = local_1450;
      local_538 = &short_match_max_backward;
      cur_ix_masked_1 = (size_t)orig_matches;
      max_comp_len = uVar9 & ringbuffer_mask;
      local_4f0 = 0x80;
      local_1478 = uVar14;
      if (0x7f < uVar14) {
        local_1478 = 0x80;
      }
      _key = local_1478;
      buckets._4_4_ = (uint)(0x7f < uVar14);
      local_528 = uVar14;
      local_520 = ringbuffer_mask;
      local_518 = uVar9;
      local_510 = ringbuffer;
      local_508 = local_678;
      local_4e8 = uVar14;
      buckets._0_4_ = HashBytesH10(ringbuffer + max_comp_len);
      forest = (local_508->_H2).buckets_;
      prev_ix_1 = (local_508->_H65).ha.hash_mask_;
      uVar1 = forest[(uint32_t)buckets];
      local_400 = local_508;
      local_408 = local_518;
      node_right = (local_518 & (local_508->_H5).bucket_size_) << 1;
      local_3d0 = local_508;
      local_3d8 = local_518;
      best_len_left = (local_518 & (local_508->_H5).bucket_size_) * 2 + 1;
      best_len_right = 0;
      depth_remaining = 0;
      if (buckets._4_4_ != 0) {
        forest[(uint32_t)buckets] = (uint32_t)local_518;
      }
      backward_1 = 0x40;
      while( true ) {
        node_left = (size_t)uVar1;
        prev_ix_masked = local_518 - node_left;
        cur_len = node_left & local_520;
        if (((prev_ix_masked == 0) || (local_530 < prev_ix_masked)) || (backward_1 == 0)) break;
        local_4f8 = best_len_right;
        local_500 = depth_remaining;
        if (best_len_right < depth_remaining) {
          local_1480 = best_len_right;
        }
        else {
          local_1480 = depth_remaining;
        }
        len_1 = local_1480;
        local_4b0 = local_510 + max_comp_len + local_1480;
        local_4b8 = (ulong *)(local_510 + cur_len + local_1480);
        matched_1 = local_528 - local_1480;
        limit2_1 = 0;
        x_1 = (matched_1 >> 3) + 1;
LAB_0013835b:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          local_450 = local_4b8;
          local_458 = (ulong *)(local_4b0 + limit2_1);
          if (*local_4b8 == *local_458) goto LAB_001383bd;
          local_460 = local_4b8;
          local_468 = (ulong *)(local_4b0 + limit2_1);
          iVar7 = 0;
          matching_bits_1 = *local_4b8 ^ *local_468;
          for (uVar14 = matching_bits_1; (uVar14 & 1) == 0;
              uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            iVar7 = iVar7 + 1;
          }
          local_4e0 = (ulong)iVar7;
          local_4a8 = (local_4e0 >> 3) + limit2_1;
          goto LAB_001384fe;
        }
        matched_1 = (matched_1 & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (local_4b0[limit2_1] != (uint8_t)*local_4b8) {
            local_4a8 = limit2_1;
            goto LAB_001384fe;
          }
          local_4b8 = (ulong *)((long)local_4b8 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_4a8 = limit2_1;
LAB_001384fe:
        local_5b8 = local_1480 + local_4a8;
        limit2_1 = local_4a8;
        if ((cur_ix_masked_1 != 0) && (*local_538 < local_5b8)) {
          *local_538 = local_5b8;
          local_490 = cur_ix_masked_1;
          local_498 = prev_ix_masked;
          local_4a0 = local_5b8;
          *(int *)cur_ix_masked_1 = (int)prev_ix_masked;
          *(int *)(cur_ix_masked_1 + 4) = (int)(local_5b8 << 5);
          cur_ix_masked_1 = cur_ix_masked_1 + 8;
        }
        if (_key <= local_5b8) {
          if (buckets._4_4_ != 0) {
            local_420 = local_508;
            local_428 = node_left;
            *(undefined4 *)(prev_ix_1 + node_right * 4) =
                 *(undefined4 *)(prev_ix_1 + (node_left & (local_508->_H5).bucket_size_) * 8);
            local_3f0 = local_508;
            local_3f8 = node_left;
            *(undefined4 *)(prev_ix_1 + best_len_left * 4) =
                 *(undefined4 *)(prev_ix_1 + 4 + (node_left & (local_508->_H5).bucket_size_) * 8);
          }
          goto LAB_001387bd;
        }
        if (local_510[cur_len + local_5b8] < local_510[max_comp_len + local_5b8]) {
          best_len_right = local_5b8;
          if (buckets._4_4_ != 0) {
            *(int *)(prev_ix_1 + node_right * 4) = (int)node_left;
          }
          local_3e0 = local_508;
          local_3e8 = node_left;
          node_right = (node_left & (local_508->_H5).bucket_size_) * 2 + 1;
          uVar1 = *(uint *)(prev_ix_1 + node_right * 4);
        }
        else {
          depth_remaining = local_5b8;
          if (buckets._4_4_ != 0) {
            *(int *)(prev_ix_1 + best_len_left * 4) = (int)node_left;
          }
          local_410 = local_508;
          local_418 = node_left;
          uVar14 = node_left & (local_508->_H5).bucket_size_;
          best_len_left = uVar14 * 2;
          uVar1 = *(uint *)(prev_ix_1 + uVar14 * 8);
        }
        backward_1 = backward_1 - 1;
      }
      if (buckets._4_4_ != 0) {
        *(int *)(prev_ix_1 + node_right * 4) = (local_508->_H5).hash_shift_;
        *(int *)(prev_ix_1 + best_len_left * 4) = (local_508->_H5).hash_shift_;
      }
LAB_001387bd:
      orig_matches = (BackwardMatch *)cur_ix_masked_1;
    }
    for (prev_ix = 0; prev_ix < 0x26; prev_ix = prev_ix + 1) {
      dict_matches[prev_ix - 2] = 0xfffffff;
    }
    local_658 = short_match_max_backward + 1;
    local_650 = 4;
    local_1490 = local_658;
    if (local_658 < 4) {
      local_1490 = 4;
    }
    iVar7 = BrotliFindAllStaticDictionaryMatches
                      (local_680,local_688 + best_len,local_1490,local_6a0,(uint32_t *)&i_1);
    if (iVar7 != 0) {
      local_668 = 0x25;
      local_670 = local_6a0;
      if (local_6a0 < 0x26) {
        local_1498 = local_6a0;
      }
      else {
        local_1498 = 0x25;
      }
      for (uStack_7c0 = local_1490; pBVar6 = orig_matches, uStack_7c0 <= local_1498;
          uStack_7c0 = uStack_7c0 + 1) {
        local_14a8 = dict_matches[uStack_7c0 - 2];
        if ((local_14a8 < 0xfffffff) &&
           (uVar14 = local_6b0 + (local_14a8 >> 5) + 1, uVar14 <= (local_6b8->dist).max_distance)) {
          orig_matches = orig_matches + 1;
          local_14a8 = local_14a8 & 0x1f;
          local_470 = pBVar6;
          local_478 = uVar14;
          local_480 = uStack_7c0;
          local_488 = (ulong)local_14a8;
          pBVar6->distance = (uint32_t)uVar14;
          if (uStack_7c0 == local_14a8) {
            local_14a8 = 0;
          }
          pBVar6->length_and_code = (uint)(uStack_7c0 << 5) | local_14a8;
        }
      }
    }
    lVar12 = (long)((long)orig_matches - cur_ix_masked) >> 3;
    uVar14 = i + lVar12;
    for (_new_size = i; _new_size + 1 < uVar14; _new_size = _new_size + 1) {
    }
    local_1438[orig_num_literals] = (uint32_t)lVar12;
    sVar3 = i;
    if (lVar12 != 0) {
      local_660 = gap + (uVar14 - 1) * 8;
      uVar10 = (ulong)(*(uint *)(local_660 + 4) >> 5);
      sVar3 = uVar14;
      if (0x145 < uVar10) {
        *(undefined8 *)(gap + i * 8) = *(undefined8 *)(gap + (uVar14 - 1) * 8);
        local_1438[orig_num_literals] = 1;
        local_618 = &hasher->privat;
        local_648 = uVar9 + 1;
        local_14d0 = uVar9 + uVar10;
        if (local_1440 <= local_14d0) {
          local_14d0 = local_1440;
        }
        i_2 = local_14d0;
        j_1 = local_648;
        if (uVar9 + 0x40 <= local_14d0) {
          j_1 = local_14d0 - 0x3f;
        }
        local_630 = local_648;
        local_628 = ringbuffer_mask;
        local_620 = ringbuffer;
        if (uVar9 + 0x201 <= j_1) {
          for (; local_648 < j_1; local_648 = local_648 + 8) {
            local_3a8 = local_618;
            local_3b0 = local_620;
            local_3b8 = local_628;
            max_backward = local_648;
            local_3c8 = (local_618->_H5).bucket_size_ - 0xf;
            local_2f0 = local_618;
            local_2f8 = local_620;
            local_300 = local_648;
            local_308 = local_628;
            local_310 = 0x80;
            local_320 = (ulong *)0x0;
            cur_ix_masked_2 = 0;
            max_comp_len_1 = local_648 & local_628;
            local_2d0 = 0x80;
            local_2d8 = 0x80;
            _key_1 = 0x80;
            buckets_1._4_4_ = 1;
            local_318 = local_3c8;
            buckets_1._0_4_ = HashBytesH10(local_620 + max_comp_len_1);
            forest_1 = (local_2f0->_H2).buckets_;
            prev_ix_2 = (size_t)(local_2f0->_H40).common;
            uVar1 = forest_1[(uint32_t)buckets_1];
            local_228 = local_2f0;
            local_230 = local_300;
            node_right_1 = (local_300 & (local_2f0->_H5).bucket_size_) << 1;
            local_1f8 = local_2f0;
            local_200 = local_300;
            best_len_left_1 = (local_300 & (local_2f0->_H5).bucket_size_) * 2 + 1;
            best_len_right_1 = 0;
            depth_remaining_1 = 0;
            if (buckets_1._4_4_ != 0) {
              forest_1[(uint32_t)buckets_1] = (uint32_t)local_300;
            }
            backward_2 = 0x40;
            while( true ) {
              node_left_1 = (size_t)uVar1;
              prev_ix_masked_1 = local_300 - node_left_1;
              cur_len_1 = node_left_1 & local_308;
              if (((prev_ix_masked_1 == 0) || (local_318 < prev_ix_masked_1)) || (backward_2 == 0))
              break;
              local_2e0 = best_len_right_1;
              local_2e8 = depth_remaining_1;
              if (best_len_right_1 < depth_remaining_1) {
                local_14e0 = best_len_right_1;
              }
              else {
                local_14e0 = depth_remaining_1;
              }
              len_2 = local_14e0;
              local_298 = local_2f8 + max_comp_len_1 + local_14e0;
              local_2a0 = (ulong *)(local_2f8 + cur_len_1 + local_14e0);
              matched_2 = local_310 - local_14e0;
              limit2_2 = 0;
              x_2 = (matched_2 >> 3) + 1;
LAB_00139069:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                local_258 = local_2a0;
                local_260 = (ulong *)(local_298 + limit2_2);
                if (*local_2a0 == *local_260) goto LAB_001390cb;
                local_268 = local_2a0;
                local_270 = (ulong *)(local_298 + limit2_2);
                iVar7 = 0;
                matching_bits_2 = *local_2a0 ^ *local_270;
                for (uVar9 = matching_bits_2; (uVar9 & 1) == 0;
                    uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                  iVar7 = iVar7 + 1;
                }
                local_2c8 = (ulong)iVar7;
                local_290 = (local_2c8 >> 3) + limit2_2;
                goto LAB_0013920c;
              }
              matched_2 = (matched_2 & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (local_298[limit2_2] != (uint8_t)*local_2a0) {
                  local_290 = limit2_2;
                  goto LAB_0013920c;
                }
                local_2a0 = (ulong *)((long)local_2a0 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_290 = limit2_2;
LAB_0013920c:
              local_3a0 = local_14e0 + local_290;
              if ((cur_ix_masked_2 != 0) && (*local_320 < local_3a0)) {
                *local_320 = local_3a0;
                local_278 = cur_ix_masked_2;
                *(int *)cur_ix_masked_2 = (int)prev_ix_masked_1;
                *(int *)(cur_ix_masked_2 + 4) = (int)local_3a0 * 0x20;
                cur_ix_masked_2 = cur_ix_masked_2 + 8;
                local_288 = local_3a0;
                local_280 = prev_ix_masked_1;
              }
              limit2_2 = local_290;
              if (_key_1 <= local_3a0) {
                if (buckets_1._4_4_ != 0) {
                  local_248 = local_2f0;
                  local_250 = node_left_1;
                  *(undefined4 *)((long)&((HasherCommon *)prev_ix_2)->extra + node_right_1 * 4) =
                       *(undefined4 *)
                        (&((HasherCommon *)prev_ix_2)->extra +
                        (node_left_1 & (local_2f0->_H5).bucket_size_));
                  local_218 = local_2f0;
                  local_220 = node_left_1;
                  *(undefined4 *)((long)&((HasherCommon *)prev_ix_2)->extra + best_len_left_1 * 4) =
                       *(undefined4 *)
                        ((long)&((HasherCommon *)prev_ix_2)->extra +
                        (node_left_1 & (local_2f0->_H5).bucket_size_) * 8 + 4);
                }
                goto LAB_001394cb;
              }
              if (local_2f8[cur_len_1 + local_3a0] < local_2f8[max_comp_len_1 + local_3a0]) {
                if (buckets_1._4_4_ != 0) {
                  *(uint *)((long)&((HasherCommon *)prev_ix_2)->extra + node_right_1 * 4) = uVar1;
                }
                local_208 = local_2f0;
                local_210 = node_left_1;
                uVar9 = node_left_1 & (local_2f0->_H5).bucket_size_;
                node_right_1 = uVar9 * 2 + 1;
                uVar1 = *(uint *)((long)&((HasherCommon *)prev_ix_2)->extra + uVar9 * 8 + 4);
                best_len_right_1 = local_3a0;
              }
              else {
                if (buckets_1._4_4_ != 0) {
                  *(uint *)((long)&((HasherCommon *)prev_ix_2)->extra + best_len_left_1 * 4) = uVar1
                  ;
                }
                local_238 = local_2f0;
                local_240 = node_left_1;
                uVar9 = node_left_1 & (local_2f0->_H5).bucket_size_;
                best_len_left_1 = uVar9 * 2;
                uVar1 = *(uint *)(&((HasherCommon *)prev_ix_2)->extra + uVar9);
                depth_remaining_1 = local_3a0;
              }
              backward_2 = backward_2 - 1;
            }
            if (buckets_1._4_4_ != 0) {
              *(int *)((long)&((HasherCommon *)prev_ix_2)->extra + node_right_1 * 4) =
                   (local_2f0->_H5).hash_shift_;
              *(int *)((long)&((HasherCommon *)prev_ix_2)->extra + best_len_left_1 * 4) =
                   (local_2f0->_H5).hash_shift_;
            }
LAB_001394cb:
          }
        }
        for (; j_1 < i_2; j_1 = j_1 + 1) {
          local_1d0 = local_618;
          local_1d8 = local_620;
          local_1e0 = local_628;
          max_backward_1 = j_1;
          local_1f0 = (local_618->_H5).bucket_size_ - 0xf;
          local_118 = local_618;
          local_120 = local_620;
          local_128 = j_1;
          local_130 = local_628;
          local_138 = 0x80;
          local_148 = (ulong *)0x0;
          cur_ix_masked_3 = 0;
          max_comp_len_2 = j_1 & local_628;
          local_f8 = 0x80;
          local_100 = 0x80;
          _key_2 = 0x80;
          buckets_2._4_4_ = 1;
          local_140 = local_1f0;
          buckets_2._0_4_ = HashBytesH10(local_620 + max_comp_len_2);
          forest_2 = (local_118->_H2).buckets_;
          prev_ix_3 = (size_t)(local_118->_H40).common;
          uVar1 = forest_2[(uint32_t)buckets_2];
          local_50 = local_118;
          local_58 = local_128;
          node_right_2 = (local_128 & (local_118->_H5).bucket_size_) << 1;
          local_20 = local_118;
          local_28 = local_128;
          best_len_left_2 = (local_128 & (local_118->_H5).bucket_size_) * 2 + 1;
          best_len_right_2 = 0;
          depth_remaining_2 = 0;
          if (buckets_2._4_4_ != 0) {
            forest_2[(uint32_t)buckets_2] = (uint32_t)local_128;
          }
          backward_3 = 0x40;
          while( true ) {
            node_left_2 = (size_t)uVar1;
            prev_ix_masked_2 = local_128 - node_left_2;
            cur_len_2 = node_left_2 & local_130;
            if (((prev_ix_masked_2 == 0) || (local_140 < prev_ix_masked_2)) || (backward_3 == 0))
            break;
            local_108 = best_len_right_2;
            local_110 = depth_remaining_2;
            if (best_len_right_2 < depth_remaining_2) {
              local_14f8 = best_len_right_2;
            }
            else {
              local_14f8 = depth_remaining_2;
            }
            len_3 = local_14f8;
            local_c0 = local_120 + max_comp_len_2 + local_14f8;
            local_c8 = (ulong *)(local_120 + cur_len_2 + local_14f8);
            matched_3 = local_138 - local_14f8;
            limit2_3 = 0;
            x_3 = (matched_3 >> 3) + 1;
LAB_00139897:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              local_80 = local_c8;
              local_88 = (ulong *)(local_c0 + limit2_3);
              if (*local_c8 == *local_88) goto LAB_001398ed;
              local_90 = local_c8;
              local_98 = (ulong *)(local_c0 + limit2_3);
              iVar7 = 0;
              matching_bits_3 = *local_c8 ^ *local_98;
              for (uVar9 = matching_bits_3; (uVar9 & 1) == 0;
                  uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                iVar7 = iVar7 + 1;
              }
              local_f0 = (ulong)iVar7;
              local_b8 = (local_f0 >> 3) + limit2_3;
              goto LAB_00139a2b;
            }
            matched_3 = (matched_3 & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (local_c0[limit2_3] != (uint8_t)*local_c8) {
                local_b8 = limit2_3;
                goto LAB_00139a2b;
              }
              local_c8 = (ulong *)((long)local_c8 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_b8 = limit2_3;
LAB_00139a2b:
            local_1c8 = local_14f8 + local_b8;
            if ((cur_ix_masked_3 != 0) && (*local_148 < local_1c8)) {
              *local_148 = local_1c8;
              local_a0 = cur_ix_masked_3;
              *(int *)cur_ix_masked_3 = (int)prev_ix_masked_2;
              *(int *)(cur_ix_masked_3 + 4) = (int)local_1c8 * 0x20;
              cur_ix_masked_3 = cur_ix_masked_3 + 8;
              local_b0 = local_1c8;
              local_a8 = prev_ix_masked_2;
            }
            limit2_3 = local_b8;
            if (_key_2 <= local_1c8) {
              if (buckets_2._4_4_ != 0) {
                local_70 = local_118;
                local_78 = node_left_2;
                *(undefined4 *)((long)&((HasherCommon *)prev_ix_3)->extra + node_right_2 * 4) =
                     *(undefined4 *)
                      (&((HasherCommon *)prev_ix_3)->extra +
                      (node_left_2 & (local_118->_H5).bucket_size_));
                local_40 = local_118;
                local_48 = node_left_2;
                *(undefined4 *)((long)&((HasherCommon *)prev_ix_3)->extra + best_len_left_2 * 4) =
                     *(undefined4 *)
                      ((long)&((HasherCommon *)prev_ix_3)->extra +
                      (node_left_2 & (local_118->_H5).bucket_size_) * 8 + 4);
              }
              goto LAB_00139caf;
            }
            if (local_120[cur_len_2 + local_1c8] < local_120[max_comp_len_2 + local_1c8]) {
              if (buckets_2._4_4_ != 0) {
                *(uint *)((long)&((HasherCommon *)prev_ix_3)->extra + node_right_2 * 4) = uVar1;
              }
              local_30 = local_118;
              local_38 = node_left_2;
              uVar9 = node_left_2 & (local_118->_H5).bucket_size_;
              node_right_2 = uVar9 * 2 + 1;
              uVar1 = *(uint *)((long)&((HasherCommon *)prev_ix_3)->extra + uVar9 * 8 + 4);
              best_len_right_2 = local_1c8;
            }
            else {
              if (buckets_2._4_4_ != 0) {
                *(uint *)((long)&((HasherCommon *)prev_ix_3)->extra + best_len_left_2 * 4) = uVar1;
              }
              local_60 = local_118;
              local_68 = node_left_2;
              uVar9 = node_left_2 & (local_118->_H5).bucket_size_;
              best_len_left_2 = uVar9 * 2;
              uVar1 = *(uint *)(&((HasherCommon *)prev_ix_3)->extra + uVar9);
              depth_remaining_2 = local_1c8;
            }
            backward_3 = backward_3 - 1;
          }
          if (buckets_2._4_4_ != 0) {
            *(int *)((long)&((HasherCommon *)prev_ix_3)->extra + node_right_2 * 4) =
                 (local_118->_H5).hash_shift_;
            *(int *)((long)&((HasherCommon *)prev_ix_3)->extra + best_len_left_2 * 4) =
                 (local_118->_H5).hash_shift_;
          }
LAB_00139caf:
        }
        memset(local_1438 + orig_num_literals + 1,0,(uVar10 - 1) * 4);
        orig_num_literals = (uVar10 - 1) + orig_num_literals;
        sVar3 = i + 1;
      }
    }
    i = sVar3;
    orig_num_literals = orig_num_literals + 1;
  } while( true );
LAB_001383bd:
  local_4b8 = local_4b8 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0013835b;
LAB_001390cb:
  local_2a0 = local_2a0 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00139069;
LAB_001398ed:
  local_c8 = local_c8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00139897;
LAB_00137df3:
  local_5e8 = local_5e8 + 1;
  limit2 = limit2 + 8;
  goto LAB_00137d91;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  BROTLI_UNUSED(literal_context_lut);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(num_matches) ||
      BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, &model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}